

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSendQueue.cpp
# Opt level: O2

void __thiscall Scs::SendQueue::Push(SendQueue *this,void *data,size_t bytes)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  uchar local_58 [4];
  undefined4 local_54;
  pthread_mutex_t *local_50;
  BufferPtr buffer;
  
  local_50 = (pthread_mutex_t *)&this->m_mutex;
  std::mutex::lock((mutex *)&local_50->__data);
  uVar2 = bytes + 8;
  bVar1 = true;
  do {
    if (uVar2 == 0) {
      pthread_mutex_unlock(local_50);
      return;
    }
    uVar3 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar3 = uVar2;
    }
    CreateBuffer();
    if (bVar1) {
      if (0xfffffffe < bytes) {
        __assert_fail("bytes < 0xFFFFFFFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsSendQueue.cpp"
                      ,0x45,"void Scs::SendQueue::Push(const void *, size_t)");
      }
      builtin_memcpy(local_58,"scsm",4);
      local_54 = (undefined4)bytes;
      std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char*,void>
                ((vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                 buffer.
                 super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(const_iterator)
                         *(uchar **)
                          &((buffer.
                             super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->
                           super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                           _M_impl.field_0x8,local_58,(uchar *)&local_50);
      uVar2 = uVar2 - 8;
      uVar3 = uVar3 - 8;
    }
    std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
               buffer.
               super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(const_iterator)
                       *(uchar **)
                        &((buffer.
                           super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>)._M_impl.
                         field_0x8,(uchar *)data,(uchar *)((long)data + uVar3));
    std::
    deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
    ::push_back(&this->m_queue,&buffer);
    uVar2 = uVar2 - uVar3;
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &buffer.
                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    bVar1 = false;
    data = (uchar *)((long)data + uVar3);
  } while( true );
}

Assistant:

void SendQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);

	// Track data and bytes remaining to queue
	uint8_t * ptrData = (uint8_t *)data;
	size_t bytesRemaining = bytes + sizeof(MessageHeader);
	bool firstWrite = true;
	while (bytesRemaining)
	{
		size_t bytesToWrite = std::min(bytesRemaining, SEND_BUFFER_SIZE);
		BufferPtr buffer = CreateBuffer();
		if (firstWrite)
		{
			// Single message sizes over 4GB aren't supported, which is a
			// ridiculous size for a single TCP/IP message anyhow.
			assert(bytes < 0xFFFFFFFF);
			MessageHeader header;
			header.size = static_cast<uint32_t>(bytes);	
			buffer->insert(buffer->end(), reinterpret_cast<uint8_t *>(&header), reinterpret_cast<uint8_t *>(&header) + sizeof(MessageHeader));
			bytesRemaining -= sizeof(MessageHeader);
			bytesToWrite -= sizeof(MessageHeader);
			firstWrite = false;
		}
		buffer->insert(buffer->end(), ptrData, ptrData + bytesToWrite);
		m_queue.push_back(buffer);
		ptrData += bytesToWrite;
		bytesRemaining -= bytesToWrite;
	}
	assert(bytesRemaining == 0);
}